

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

void Js::DynamicProfileInfo::DumpProfiledValue(char16 *name,ValueType *value,uint count)

{
  char16_t *form;
  ulong uVar1;
  uint uVar2;
  char local_138 [8];
  char valueStr [256];
  
  if (count != 0) {
    Output::Print(L"    %-16s(%2d):",name);
    uVar1 = 0;
    while( true ) {
      uVar2 = (uint)uVar1;
      if (count == uVar1) break;
      if (uVar1 == 0) {
        uVar2 = 0;
        form = L" ";
      }
      else {
        form = L"\n                          ";
        if ((int)((uVar1 & 0xffffffff) / 10) * -10 + uVar2 != 0) {
          form = L" ";
        }
      }
      Output::Print(form);
      Output::Print(L"%2d:",(ulong)uVar2);
      ValueType::ToString(value,(char (*) [256])local_138);
      Output::Print(L"  %S",(char (*) [256])local_138);
      uVar1 = uVar1 + 1;
      value = value + 1;
    }
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void DynamicProfileInfo::DumpProfiledValue(char16 const * name, ValueType * value, uint count)
    {
        if (count != 0)
        {
            Output::Print(_u("    %-16s(%2d):"), name, count);
            for (uint i = 0; i < count; i++)
            {
                Output::Print(i != 0 && (i % 10) == 0 ? _u("\n                          ") : _u(" "));
                Output::Print(_u("%2d:"), i);
                char valueStr[VALUE_TYPE_MAX_STRING_SIZE];
                value[i].ToString(valueStr);
                Output::Print(_u("  %S"), valueStr);
            }
            Output::Print(_u("\n"));
        }
    }